

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cpp
# Opt level: O2

void __thiscall hmac_hash::SHA512::transform(SHA512 *this,uint8_t *message,size_t block_nb)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  uint8_t *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong local_318 [12];
  ulong auStack_2b8 [81];
  
  puVar6 = message + 7;
  for (sVar3 = 0; sVar3 != block_nb; sVar3 = sVar3 + 1) {
    for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
      uVar2 = *(ulong *)(puVar6 + lVar1 * 8 + -7);
      auStack_2b8[lVar1] =
           uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
           (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
           (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    }
    for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
      uVar2 = auStack_2b8[lVar1 + 0xe];
      uVar4 = auStack_2b8[lVar1 + 1];
      auStack_2b8[lVar1 + 0x10] =
           (uVar2 >> 6 ^ (uVar2 << 3 | uVar2 >> 0x3d) ^ (uVar2 << 0x2d | uVar2 >> 0x13)) +
           auStack_2b8[lVar1 + 9] + auStack_2b8[lVar1] +
           (uVar4 >> 7 ^
           (uVar4 << 0x38 | uVar4 >> 8) ^ (uVar4 >> 1 | (ulong)((uVar4 & 1) != 0) << 0x3f));
    }
    for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
      local_318[lVar1] = this->m_h[lVar1];
    }
    for (lVar1 = 0; uVar7 = local_318[1], uVar4 = local_318[4], uVar2 = local_318[6], lVar1 != 0x280
        ; lVar1 = lVar1 + 8) {
      lVar5 = ((uVar4 << 0x17 | uVar4 >> 0x29) ^
              (uVar4 << 0x2e | uVar4 >> 0x12) ^ (uVar4 << 0x32 | uVar4 >> 0xe)) + local_318[7] +
              *(long *)((long)&sha512_k + lVar1) + ((local_318[5] ^ uVar2) & uVar4 ^ uVar2) +
              *(long *)((long)auStack_2b8 + lVar1);
      uVar8 = local_318[2] ^ uVar7;
      uVar9 = local_318[2] & uVar7;
      local_318[6] = local_318[5];
      local_318[4] = local_318[3] + lVar5;
      local_318[3] = local_318[2];
      local_318[5] = uVar4;
      local_318[1] = local_318[0];
      local_318[2] = uVar7;
      local_318[7] = uVar2;
      local_318[0] = (uVar9 ^ uVar8 & local_318[0]) +
                     ((local_318[0] << 0x19 | local_318[0] >> 0x27) ^
                     (local_318[0] << 0x1e | local_318[0] >> 0x22) ^
                     (local_318[0] << 0x24 | local_318[0] >> 0x1c)) + lVar5;
    }
    local_318[4] = uVar4;
    local_318[6] = uVar2;
    local_318[1] = uVar7;
    for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
      this->m_h[lVar1] = this->m_h[lVar1] + local_318[lVar1];
    }
    puVar6 = puVar6 + 0x80;
  }
  return;
}

Assistant:

void SHA512::transform(const uint8_t *message, size_t block_nb) {
        uint64_t w[80];
        uint64_t wv[8];
        uint64_t t1, t2;
        const uint8_t *sub_block;
        size_t i, j;
        for(i = 0; i < block_nb; ++i) {
            sub_block = message + (i << 7);
            for(j = 0; j < 16; ++j) {
                SHA2_PACK64(&sub_block[j << 3], &w[j]);
            }
            for(j = 16; j < 80; ++j) {
                w[j] =  SHA512_F4(w[j -  2]) + w[j -  7] + SHA512_F3(w[j - 15]) + w[j - 16];
            }
            for(j = 0; j < 8; ++j) {
                wv[j] = m_h[j];
            }
            for(j = 0; j < 80; ++j) {
                t1 = wv[7] + SHA512_F2(wv[4]) + SHA2_CH(wv[4], wv[5], wv[6])
                    + sha512_k[j] + w[j];
                t2 = SHA512_F1(wv[0]) + SHA2_MAJ(wv[0], wv[1], wv[2]);
                wv[7] = wv[6];
                wv[6] = wv[5];
                wv[5] = wv[4];
                wv[4] = wv[3] + t1;
                wv[3] = wv[2];
                wv[2] = wv[1];
                wv[1] = wv[0];
                wv[0] = t1 + t2;
            }
            for(j = 0; j < 8; ++j) {
                m_h[j] += wv[j];
            }
        }
    }